

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

t_object *
xemmai::t_type_of<xemmai::t_string>::f__construct(t_type *a_class,wchar_t *a_p,size_t a_n)

{
  t_object *ptVar1;
  unsigned_long __n2;
  char *__dest;
  
  ptVar1 = f__construct(a_class,a_n);
  *(size_t *)ptVar1->v_data = a_n;
  __dest = ptVar1->v_data + 8;
  if (a_n != 0) {
    memmove(__dest,a_p,a_n * 4);
    __dest = __dest + a_n * 4;
  }
  __dest[0] = '\0';
  __dest[1] = '\0';
  __dest[2] = '\0';
  __dest[3] = '\0';
  return ptVar1;
}

Assistant:

static t_object* f__construct(t_type* a_class, const wchar_t* a_p, size_t a_n)
	{
		auto object = f__construct(a_class, a_n);
		*std::copy_n(a_p, a_n, (new(object->f_data()) t_string(a_n))->f_entries()) = L'\0';
		return object;
	}